

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

void rw::d3d8::writeNativeTexture(Texture *tex,Stream *stream)

{
  int iVar1;
  Raster *this;
  int iVar2;
  uint32 uVar3;
  int32 iVar4;
  uint val;
  uint8 *puVar5;
  int local_4c;
  int32 i;
  uint8 *data;
  uint8 local_38;
  uint32 size;
  int32 compression;
  int32 numLevels;
  D3dRaster *ras;
  Raster *raster;
  int32 chunksize;
  Stream *stream_local;
  Texture *tex_local;
  
  uVar3 = getSizeNativeTexture(tex);
  writeChunkHeader(stream,1,uVar3 - 0xc);
  Stream::writeU32(stream,8);
  Stream::writeU32(stream,tex->filterAddressing);
  (*stream->_vptr_Stream[3])(stream,tex->name,0x20);
  (*stream->_vptr_Stream[3])(stream,tex->mask,0x20);
  iVar2 = d3d::nativeRasterOffset;
  this = tex->raster;
  iVar4 = Raster::getNumLevels(this);
  Stream::writeI32(stream,this->format);
  Stream::writeI32(stream,(uint)(*(byte *)((long)&this->stride + (long)iVar2) & 1));
  Stream::writeU16(stream,(uint16)this->width);
  Stream::writeU16(stream,(uint16)this->height);
  Stream::writeU8(stream,(uint8)this->depth);
  Stream::writeU8(stream,(uint8)iVar4);
  Stream::writeU8(stream,(uint8)this->type);
  local_38 = '\0';
  if (*(int *)((long)&this->height + (long)iVar2) != 0) {
    iVar1 = *(int *)((long)&this->height + (long)iVar2);
    if (iVar1 == 0x31545844) {
      local_38 = '\x01';
    }
    else if (iVar1 == 0x32545844) {
      local_38 = '\x02';
    }
    else if (iVar1 == 0x33545844) {
      local_38 = '\x03';
    }
    else if (iVar1 == 0x34545844) {
      local_38 = '\x04';
    }
    else {
      local_38 = '\0';
      if (iVar1 == 0x35545844) {
        local_38 = '\x05';
      }
    }
  }
  Stream::writeU8(stream,local_38);
  if ((this->format & 0x4000U) == 0) {
    if ((this->format & 0x2000U) != 0) {
      (*stream->_vptr_Stream[3])(stream,*(undefined8 *)((long)&this->flags + (long)iVar2),0x400);
    }
  }
  else {
    (*stream->_vptr_Stream[3])(stream,*(undefined8 *)((long)&this->flags + (long)iVar2),0x80);
  }
  for (local_4c = 0; local_4c < iVar4; local_4c = local_4c + 1) {
    val = d3d::getLevelSize(this,local_4c);
    Stream::writeU32(stream,val);
    puVar5 = Raster::lock(this,local_4c,2);
    (*stream->_vptr_Stream[3])(stream,puVar5,(ulong)val);
    Raster::unlock(this,local_4c);
  }
  return;
}

Assistant:

void
writeNativeTexture(Texture *tex, Stream *stream)
{
	int32 chunksize = getSizeNativeTexture(tex);
	writeChunkHeader(stream, ID_STRUCT, chunksize-12);
	stream->writeU32(PLATFORM_D3D8);

	// Texture
	stream->writeU32(tex->filterAddressing);
	stream->write8(tex->name, 32);
	stream->write8(tex->mask, 32);

	// Raster
	Raster *raster = tex->raster;
	D3dRaster *ras = GETD3DRASTEREXT(raster);
	int32 numLevels = raster->getNumLevels();
	stream->writeI32(raster->format);
	stream->writeI32(ras->hasAlpha);
	stream->writeU16(raster->width);
	stream->writeU16(raster->height);
	stream->writeU8(raster->depth);
	stream->writeU8(numLevels);
	stream->writeU8(raster->type);
	int32 compression = 0;
	if(ras->format)
		switch(ras->format){
		case 0x31545844:	// DXT1
			compression = 1;
			break;
		case 0x32545844:	// DXT2
			compression = 2;
			break;
		case 0x33545844:	// DXT3
			compression = 3;
			break;
		case 0x34545844:	// DXT4
			compression = 4;
			break;
		case 0x35545844:	// DXT5
			compression = 5;
			break;
		}
	stream->writeU8(compression);

	if(raster->format & Raster::PAL4)
		stream->write8(ras->palette, 4*32);
	else if(raster->format & Raster::PAL8)
		stream->write8(ras->palette, 4*256);

	uint32 size;
	uint8 *data;
	for(int32 i = 0; i < numLevels; i++){
		size = getLevelSize(raster, i);
		stream->writeU32(size);
		data = raster->lock(i, Raster::LOCKREAD);
		stream->write8(data, size);
		raster->unlock(i);
	}
}